

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O0

void __thiscall r_exec::_Mem::~_Mem(_Mem *this)

{
  bool bVar1;
  ostream *poVar2;
  __int_type_conflict __val;
  P<r_code::Code> *pPVar3;
  __int_type _Var4;
  void *this_00;
  iterator iVar5;
  ostream *stream;
  ostream **__end1_1;
  ostream **__begin1_1;
  ostream *(*__range1_1) [8];
  P<r_code::Code> *o;
  iterator __end1;
  iterator __begin1;
  list<core::P<r_code::Code>_> *__range1;
  _Mem *local_10;
  _Mem *this_local;
  
  *(undefined ***)this = &PTR___cxa_pure_virtual_002ec728;
  local_10 = this;
  poVar2 = std::operator<<((ostream *)&std::cout,"cores left:");
  __val = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&this->m_coreCount);
  std::__cxx11::to_string((__cxx11 *)&__range1,__val);
  poVar2 = std::operator<<(poVar2,(string *)&__range1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&__range1);
  iVar5 = r_code::list<core::P<r_code::Code>_>::begin(&this->objects);
  __end1._list = (list<core::P<r_code::Code>_> *)iVar5.super__iterator._cell;
  iVar5 = r_code::list<core::P<r_code::Code>_>::end(&this->objects);
  while( true ) {
    __end1.super__iterator._cell = (int64_t)iVar5._list;
    o = (P<r_code::Code> *)iVar5.super__iterator._cell;
    bVar1 = r_code::list<core::P<r_code::Code>_>::_iterator::operator!=
                      ((_iterator *)&__end1._list,(_iterator *)&o);
    if (!bVar1) break;
    pPVar3 = r_code::list<core::P<r_code::Code>_>::iterator::operator*((iterator *)&__end1._list);
    poVar2 = std::operator<<((ostream *)&std::cout,"refcount");
    _Var4 = std::__atomic_base::operator_cast_to_long((__atomic_base *)&pPVar3->object->refCount);
    this_00 = (void *)std::ostream::operator<<(poVar2,_Var4);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    r_code::list<core::P<r_code::Code>_>::iterator::operator++((iterator *)&__end1._list);
    iVar5._list = (list<core::P<r_code::Code>_> *)__end1.super__iterator._cell;
    iVar5.super__iterator._cell = (int64_t)o;
  }
  r_code::list<core::P<r_code::Code>_>::clear(&this->objects);
  for (__end1_1 = this->debug_streams; (Metadata **)__end1_1 != &this->metadata;
      __end1_1 = __end1_1 + 1) {
    if (*__end1_1 != (ostream *)0x0) {
      (*(*__end1_1)->_vptr_basic_ostream[1])();
    }
  }
  std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::~vector(&this->initial_groups);
  core::P<r_exec::Group>::~P(&this->_root);
  r_code::list<core::P<r_code::Code>_>::~list(&this->objects);
  std::condition_variable::~condition_variable(&this->m_coresRunning);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->m_coreThreads);
  JobQueue<r_exec::TimeJob>::~JobQueue(&this->m_timeJobQueue);
  JobQueue<r_exec::_ReductionJob>::~JobQueue(&this->m_reductionJobQueue);
  return;
}

Assistant:

_Mem::~_Mem()
{
    std::cout << "cores left:" << std::to_string(m_coreCount) << std::endl;
    for (const auto &o : objects) {
        std::cout << "refcount" << o.object->refCount << std::endl;
    }
    objects.clear();
    for (std::ostream *stream : debug_streams) {
        delete stream;
    }
}